

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::deleteTextures(ReferenceContext *this,int numTextures,deUint32 *textures)

{
  Texture *texture;
  ulong uVar1;
  
  if (0 < numTextures) {
    uVar1 = 0;
    do {
      if (textures[uVar1] == 0) {
        texture = (Texture *)0x0;
      }
      else {
        texture = rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,textures[uVar1]);
      }
      if (texture != (Texture *)0x0) {
        deleteTexture(this,texture);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)numTextures != uVar1);
  }
  return;
}

Assistant:

void ReferenceContext::deleteTextures (int numTextures, const deUint32* textures)
{
	for (int i = 0; i < numTextures; i++)
	{
		deUint32	name		= textures[i];
		Texture*	texture		= name ? m_textures.find(name) : DE_NULL;

		if (texture)
			deleteTexture(texture);
	}
}